

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset_zone.cpp
# Opt level: O0

void __thiscall
sf2cute::SFPresetZone::SFPresetZone
          (SFPresetZone *this,weak_ptr<sf2cute::SFInstrument> *instrument,
          vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *generators,
          vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *modulators)

{
  vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> local_58;
  vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> local_40;
  vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *local_28;
  vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *modulators_local;
  vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *generators_local;
  weak_ptr<sf2cute::SFInstrument> *instrument_local;
  SFPresetZone *this_local;
  
  local_28 = modulators;
  modulators_local =
       (vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_> *)generators;
  generators_local =
       (vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_> *)instrument;
  instrument_local = (weak_ptr<sf2cute::SFInstrument> *)this;
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::vector
            (&local_40,generators);
  std::vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>::vector
            (&local_58,modulators);
  SFZone::SFZone(&this->super_SFZone,&local_40,&local_58);
  std::vector<sf2cute::SFModulatorItem,_std::allocator<sf2cute::SFModulatorItem>_>::~vector
            (&local_58);
  std::vector<sf2cute::SFGeneratorItem,_std::allocator<sf2cute::SFGeneratorItem>_>::~vector
            (&local_40);
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFPresetZone_001637b8;
  std::weak_ptr<sf2cute::SFInstrument>::weak_ptr(&this->instrument_,instrument);
  this->parent_preset_ = (SFPreset *)0x0;
  return;
}

Assistant:

SFPresetZone::SFPresetZone(std::weak_ptr<SFInstrument> instrument,
    std::vector<SFGeneratorItem> generators,
    std::vector<SFModulatorItem> modulators) :
    SFZone(std::move(generators), std::move(modulators)),
    instrument_(std::move(instrument)),
    parent_preset_(nullptr) {
}